

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O2

int __thiscall CMU462::Timeline::previousImportantTime(Timeline *this)

{
  int iVar1;
  _Self __tmp;
  iterator iVar2;
  long lVar3;
  
  iVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          lower_bound(&(this->times)._M_t,&this->current_frame);
  if (iVar2._M_node == (this->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    iVar1 = -1;
  }
  else {
    lVar3 = std::_Rb_tree_decrement(iVar2._M_node);
    iVar1 = *(int *)(lVar3 + 0x20);
  }
  return iVar1;
}

Assistant:

int Timeline::previousImportantTime()
  {
	// NOTE : lower bound returns an iter to next > or = element.
	set<int>::iterator iter = times.lower_bound(current_frame);

	if(iter == times.begin())
	{
	  return -1;
	}


	// Iteratres back one key frame.
	// It we are currently on a key frame,
	// then lower bound would have given us back current_frame.
	iter--;

	return *iter;
  }